

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

_Bool apprun_is_path_child_of(char *path,char *base)

{
  int iVar1;
  char *__s;
  char *__s2;
  size_t sVar2;
  uint len_1;
  uint len;
  _Bool result;
  char *real_path;
  char *real_base;
  char *base_local;
  char *path_local;
  
  __s = realpath(base,(char *)0x0);
  __s2 = realpath(path,(char *)0x0);
  if ((__s == (char *)0x0) || (__s2 == (char *)0x0)) {
    sVar2 = strlen(base);
    iVar1 = strncmp(base,path,sVar2 & 0xffffffff);
  }
  else {
    sVar2 = strlen(__s);
    iVar1 = strncmp(__s,__s2,sVar2 & 0xffffffff);
  }
  len_1._3_1_ = iVar1 == 0;
  if (__s != (char *)0x0) {
    free(__s);
  }
  if (__s2 != (char *)0x0) {
    free(__s2);
  }
  return len_1._3_1_;
}

Assistant:

bool apprun_is_path_child_of(const char *path, const char *base) {
    char *real_base = realpath(base, NULL);
    char *real_path = realpath(path, NULL);

    bool result;

    if (real_base != NULL && real_path != NULL) {
        unsigned int len = strlen(real_base);
        result = strncmp(real_base, real_path, len) == 0;
    } else {
        unsigned int len = strlen(base);
        result = strncmp(base, path, len) == 0;
    }

    if (real_base)
        free(real_base);

    if (real_path)
        free(real_path);
#ifdef DEBUG
    fprintf(stderr, "APPRUN_DEBUG: is %s child of %s:  %d\n", path, base, result);
#endif
    return result;
}